

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O1

bool __thiscall
soplex::SPxFastRT<double>::minReLeave
          (SPxFastRT<double> *this,double *sel,int leave,double maxabs,bool polish)

{
  double dVar1;
  SPxSolverBase<double> *pSVar2;
  UpdateVector<double> *pUVar3;
  pointer pdVar4;
  pointer pdVar5;
  Status SVar6;
  pointer pdVar7;
  double dVar8;
  double dVar9;
  
  if (-1 < leave) {
    pSVar2 = (this->super_SPxRatioTester<double>).thesolver;
    pUVar3 = pSVar2->theFvec;
    pdVar7 = (pSVar2->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (pSVar2->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pdVar7[(uint)leave] < pdVar4[(uint)leave] || pdVar7[(uint)leave] == pdVar4[(uint)leave]) {
      *sel = 0.0;
      if (!polish) {
        pdVar5 = (pUVar3->super_VectorBase<double>).val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        dVar8 = pdVar5[(uint)leave];
        pSVar2->theShift =
             (double)((ulong)(pdVar4[(uint)leave] - dVar8) & -(ulong)(dVar8 < pdVar4[(uint)leave]))
             + pSVar2->theShift;
        pdVar4[(uint)leave] = dVar8;
        dVar8 = pdVar5[(uint)leave];
        pSVar2->theShift =
             (double)(-(ulong)(pdVar7[(uint)leave] < dVar8) & (ulong)(dVar8 - pdVar7[(uint)leave]))
             + pSVar2->theShift;
        pdVar7[(uint)leave] = dVar8;
      }
    }
    else if (this->fastDelta / maxabs < *sel) {
      dVar8 = (pUVar3->thedelta).super_VectorBase<double>.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[(uint)leave];
      *sel = 0.0;
      if (!polish) {
        SVar6 = SPxBasisBase<double>::dualStatus
                          (&pSVar2->super_SPxBasisBase<double>,
                           (pSVar2->super_SPxBasisBase<double>).theBaseId.data + (uint)leave);
        if (SVar6 != D_ON_BOTH) {
          pSVar2 = (this->super_SPxRatioTester<double>).thesolver;
          dVar1 = (pUVar3->super_VectorBase<double>).val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[(uint)leave];
          if (dVar8 <= 0.0) {
            pdVar7 = (pSVar2->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            dVar8 = dVar1 - pdVar7[(uint)leave];
            dVar9 = (double)-(ulong)(pdVar7[(uint)leave] < dVar1);
          }
          else {
            pdVar7 = (pSVar2->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            dVar8 = (double)-(ulong)(dVar1 < pdVar7[(uint)leave]);
            dVar9 = pdVar7[(uint)leave] - dVar1;
          }
          pSVar2->theShift = pSVar2->theShift + (double)((ulong)dVar9 & (ulong)dVar8);
          pdVar7[(uint)leave] = dVar1;
        }
      }
    }
  }
  return SUB41((uint)leave >> 0x1f,0);
}

Assistant:

bool SPxFastRT<R>::minReLeave(R& sel, int leave, R maxabs, bool polish)
{
   UpdateVector<R>& vec = this->thesolver->fVec();
   VectorBase<R>& low = this->thesolver->lbBound();
   VectorBase<R>& up = this->thesolver->ubBound();

   if(leave < 0)
      return true;

   if(up[leave] > low[leave])
   {
      R x = vec.delta()[leave];

      if(sel > fastDelta / maxabs)
      {
         sel = 0.0;

         if(!polish
               && this->thesolver->dualStatus(this->thesolver->baseId(leave)) != SPxBasisBase<R>::Desc::D_ON_BOTH)
            // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
         {
            if(x > 0.0)
               this->thesolver->shiftLBbound(leave, vec[leave]);
            else
               this->thesolver->shiftUBbound(leave, vec[leave]);
         }
      }
   }
   else
   {
      sel = 0.0;

      // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
      if(!polish)
      {
         this->thesolver->shiftLBbound(leave, vec[leave]);
         this->thesolver->shiftUBbound(leave, vec[leave]);
      }
   }

   return false;
}